

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

ReturnType __thiscall r_comp::Preprocessor::getReturnType(Preprocessor *this,Ptr *s)

{
  int iVar1;
  ReturnType RVar2;
  
  iVar1 = std::__cxx11::string::compare
                    ((char *)&((s->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->tail);
  if (iVar1 == 0) {
    RVar2 = NUMBER;
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)&((s->
                                 super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->tail);
    if (iVar1 == 0) {
      RVar2 = TIMESTAMP;
    }
    else {
      iVar1 = std::__cxx11::string::compare
                        ((char *)&((s->
                                   super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->tail);
      if (iVar1 == 0) {
        RVar2 = BOOLEAN;
      }
      else {
        iVar1 = std::__cxx11::string::compare
                          ((char *)&((s->
                                     super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->tail);
        if (iVar1 == 0) {
          RVar2 = STRING;
        }
        else {
          iVar1 = std::__cxx11::string::compare
                            ((char *)&((s->
                                       super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->tail);
          if (iVar1 == 0) {
            RVar2 = NODE_ID;
          }
          else {
            iVar1 = std::__cxx11::string::compare
                              ((char *)&((s->
                                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->tail);
            if (iVar1 == 0) {
              RVar2 = DEVICE_ID;
            }
            else {
              iVar1 = std::__cxx11::string::compare
                                ((char *)&((s->
                                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->tail);
              if (iVar1 == 0) {
                RVar2 = FUNCTION_ID;
              }
              else {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)&((s->
                                             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr)->tail);
                RVar2 = (uint)(iVar1 == 0) * 3;
              }
            }
          }
        }
      }
    }
  }
  return RVar2;
}

Assistant:

ReturnType Preprocessor::getReturnType(RepliStruct::Ptr s)
{
    if (s->tail == ":nb") {
        return NUMBER;
    } else if (s->tail == ":us") {
        return TIMESTAMP;
    } else if (s->tail == ":bl") {
        return BOOLEAN;
    } else if (s->tail == ":st") {
        return STRING;
    } else if (s->tail == ":nid") {
        return NODE_ID;
    } else if (s->tail == ":did") {
        return DEVICE_ID;
    } else if (s->tail == ":fid") {
        return FUNCTION_ID;
    } else if (s->tail == ":[]") {
        return SET;
    }

    return ANY;
}